

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BinaryExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::BinaryExpression,slang::ast::BinaryOperator&,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&,slang::SourceRange&>
          (BumpAllocator *this,BinaryOperator *args,Type *args_1,Expression *args_2,
          Expression *args_3,SourceRange *args_4,SourceRange *args_5)

{
  SourceRange sourceRange;
  SourceRange opRange;
  BinaryExpression *left;
  SourceLocation in_RCX;
  SourceLocation in_RDX;
  SourceLocation in_R8;
  SourceLocation in_R9;
  undefined8 *in_stack_00000008;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  left = (BinaryExpression *)
         allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  sourceRange.endLoc = in_R8;
  sourceRange.startLoc = in_R9;
  opRange.endLoc = in_RDX;
  opRange.startLoc = in_RCX;
  ast::BinaryExpression::BinaryExpression
            (*(BinaryExpression **)in_R9,(BinaryOperator)((ulong)in_stack_00000008[1] >> 0x20),
             (Type *)*in_stack_00000008,(Expression *)left,(Expression *)in_stack_00000008[1],
             sourceRange,opRange);
  return left;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }